

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.h
# Opt level: O3

void __thiscall
Scine::Core::Log::Domain::printf<char_const(&)[6],int>(Domain *this,char (*args) [6],int *args_1)

{
  int iVar1;
  char *__s;
  size_t sVar2;
  _Hash_node_base *p_Var3;
  long *local_48;
  long local_40;
  long local_38 [2];
  
  iVar1 = snprintf((char *)0x0,0,*args,(ulong)(uint)*args_1);
  __s = (char *)operator_new__((long)(iVar1 + 1));
  snprintf(__s,(long)(iVar1 + 1),*args,(ulong)(uint)*args_1);
  local_48 = local_38;
  sVar2 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,__s,__s + sVar2);
  for (p_Var3 = (this->sinks_)._M_h._M_before_begin._M_nxt; p_Var3 != (_Hash_node_base *)0x0;
      p_Var3 = p_Var3->_M_nxt) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)p_Var3[5]._M_nxt,(char *)local_48,local_40);
  }
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  operator_delete__(__s);
  return;
}

Assistant:

inline void printf(Args&&... args) {
      const int sz = snprintf(NULL, 0, std::forward<Args>(args)...);
      char* buf = new char[sz + 1];
      snprintf(buf, sz + 1, std::forward<Args>(args)...);
      (*this) << std::string(buf);
      delete[] buf;
    }